

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

INT16 ymf278b_getSample(YMF278BChip *chip,YMF278BSlot *slot,UINT16 pos)

{
  byte bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 UVar4;
  UINT32 UVar5;
  ushort local_1c;
  UINT32 addr;
  INT16 sample;
  UINT16 pos_local;
  YMF278BSlot *slot_local;
  YMF278BChip *chip_local;
  
  UVar3 = slot->bits;
  if (UVar3 == '\0') {
    bVar1 = ymf278b_readMem(chip,slot->startaddr + (uint)pos);
    local_1c = (ushort)bVar1 << 8;
  }
  else if (UVar3 == '\x01') {
    UVar5 = slot->startaddr + (pos / 2) * 3;
    if ((pos & 1) == 0) {
      bVar1 = ymf278b_readMem(chip,UVar5);
      bVar2 = ymf278b_readMem(chip,UVar5 + 1);
      local_1c = (ushort)bVar1 << 8 | (bVar2 & 0xf) << 4;
    }
    else {
      bVar1 = ymf278b_readMem(chip,UVar5 + 2);
      bVar2 = ymf278b_readMem(chip,UVar5 + 1);
      local_1c = (ushort)bVar1 << 8 | bVar2 & 0xf0;
    }
  }
  else if (UVar3 == '\x02') {
    UVar5 = slot->startaddr + (uint)pos * 2;
    UVar3 = ymf278b_readMem(chip,UVar5);
    UVar4 = ymf278b_readMem(chip,UVar5 + 1);
    local_1c = CONCAT11(UVar3,UVar4);
  }
  else {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

INLINE INT16 ymf278b_getSample(YMF278BChip* chip, YMF278BSlot* slot, UINT16 pos)
{
	// TODO How does this behave when R#2 bit 0 = 1?
	//      As-if read returns 0xff? (Like for CPU memory reads.) Or is
	//      sound generation blocked at some higher level?
	INT16 sample;
	UINT32 addr;
	
	switch (slot->bits)
	{
	case 0:
		// 8 bit
		sample = ymf278b_readMem(chip, slot->startaddr + pos) << 8;
		break;
	case 1:
		// 12 bit
		addr = slot->startaddr + ((pos / 2) * 3);
		if (pos & 1)
			sample = (ymf278b_readMem(chip, addr + 2) << 8) | ((ymf278b_readMem(chip, addr + 1) & 0xF0) << 0);
		else
			sample = (ymf278b_readMem(chip, addr + 0) << 8) | ((ymf278b_readMem(chip, addr + 1) & 0x0F) << 4);
		break;
	case 2:
		// 16 bit
		addr = slot->startaddr + (pos * 2);
		sample = (ymf278b_readMem(chip, addr + 0) << 8) | ymf278b_readMem(chip, addr + 1);
		break;
	default:
		// TODO unspecified
		sample = 0;
		break;
	}
	return sample;
}